

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O0

RC __thiscall PF_FileHandle::AllocatePage(PF_FileHandle *this,PF_PageHandle *pageHandle)

{
  RC RVar1;
  int *local_30;
  char *pPageBuf;
  int pageNum;
  int rc;
  PF_PageHandle *pageHandle_local;
  PF_FileHandle *this_local;
  
  if (this->bFileOpen == 0) {
    this_local._4_4_ = 5;
  }
  else {
    _pageNum = pageHandle;
    pageHandle_local = (PF_PageHandle *)this;
    if ((this->hdr).firstFree == -1) {
      pPageBuf._0_4_ = (this->hdr).numPages;
      RVar1 = PF_BufferMgr::AllocatePage
                        (this->pBufferMgr,this->unixfd,(PageNum)pPageBuf,(char **)&local_30);
      if (RVar1 != 0) {
        return RVar1;
      }
      (this->hdr).numPages = (this->hdr).numPages + 1;
    }
    else {
      pPageBuf._0_4_ = (this->hdr).firstFree;
      RVar1 = PF_BufferMgr::GetPage
                        (this->pBufferMgr,this->unixfd,(PageNum)pPageBuf,(char **)&local_30,1);
      if (RVar1 != 0) {
        return RVar1;
      }
      (this->hdr).firstFree = *local_30;
    }
    pPageBuf._4_4_ = 0;
    this->bHdrChanged = 1;
    *local_30 = -2;
    memset(local_30 + 1,0,0xffc);
    this_local._4_4_ = MarkDirty(this,(PageNum)pPageBuf);
    if (this_local._4_4_ == 0) {
      _pageNum->pageNum = (PageNum)pPageBuf;
      _pageNum->pPageData = (char *)(local_30 + 1);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_FileHandle::AllocatePage(PF_PageHandle &pageHandle)
{
   int     rc;               // return code
   int     pageNum;          // new-page number
   char    *pPageBuf;        // address of page in buffer pool

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // If the free list isn't empty...
   if (hdr.firstFree != PF_PAGE_LIST_END) {
      pageNum = hdr.firstFree;

      // Get the first free page into the buffer
      if ((rc = pBufferMgr->GetPage(unixfd,
            pageNum,
            &pPageBuf)))
         return (rc);

      // Set the first free page to the next page on the free list
      hdr.firstFree = ((PF_PageHdr*)pPageBuf)->nextFree;
   }
   else {

      // The free list is empty...
      pageNum = hdr.numPages;

      // Allocate a new page in the file
      if ((rc = pBufferMgr->AllocatePage(unixfd,
            pageNum,
            &pPageBuf)))
         return (rc);

      // Increment the number of pages for this file
      hdr.numPages++;
   }

   // Mark the header as changed
   bHdrChanged = TRUE;

   // Mark this page as used
   ((PF_PageHdr *)pPageBuf)->nextFree = PF_PAGE_USED;

   // Zero out the page data
   memset(pPageBuf + sizeof(PF_PageHdr), 0, PF_PAGE_SIZE);

   // Mark the page dirty because we changed the next pointer
   if ((rc = MarkDirty(pageNum)))
      return (rc);

   // Set the pageHandle local variables
   pageHandle.pageNum = pageNum;
   pageHandle.pPageData = pPageBuf + sizeof(PF_PageHdr);

   // Return ok
   return (0);
}